

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void __thiscall
google::protobuf::
SplitStringToIteratorUsing<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (protobuf *this,StringPiece full,char *delim,
          back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *result)

{
  char *pcVar1;
  const_pointer pcVar2;
  size_type sVar3;
  ulong uVar4;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pbVar5;
  bool bVar6;
  StringPiece local_138;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  StringPiece local_120;
  string local_110;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  StringPiece local_e8;
  string local_d8;
  StringPiece local_b8;
  StringPiece local_a8;
  size_type local_98;
  size_type end_index;
  size_type begin_index;
  allocator local_69;
  value_type local_68;
  char *local_48;
  char *start;
  char *end;
  char *p;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pbStack_28;
  char c;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result_local;
  char *delim_local;
  StringPiece full_local;
  
  result_local = (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)full.length_;
  full_local.ptr_ = full.ptr_;
  pbStack_28 = (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)delim;
  delim_local = (char *)this;
  if ((*(char *)&result_local->container == '\0') ||
     (*(char *)((long)&result_local->container + 1) != '\0')) {
    stringpiece_internal::StringPiece::StringPiece(&local_a8,(char *)result_local);
    end_index = stringpiece_internal::StringPiece::find_first_not_of
                          ((StringPiece *)&delim_local,local_a8,0);
    while (end_index != 0xffffffffffffffff) {
      stringpiece_internal::StringPiece::StringPiece(&local_b8,(char *)result_local);
      local_98 = stringpiece_internal::StringPiece::find_first_of
                           ((StringPiece *)&delim_local,local_b8,end_index);
      if (local_98 == 0xffffffffffffffff) {
        local_e8 = stringpiece_internal::StringPiece::substr
                             ((StringPiece *)&delim_local,end_index,0xffffffffffffffff);
        stringpiece_internal::StringPiece::operator_cast_to_string(&local_d8,&local_e8);
        local_f0 = std::
                   back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++(pbStack_28,0);
        pbVar5 = std::
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_f0);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(pbVar5,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        return;
      }
      local_120 = stringpiece_internal::StringPiece::substr
                            ((StringPiece *)&delim_local,end_index,local_98 - end_index);
      stringpiece_internal::StringPiece::operator_cast_to_string(&local_110,&local_120);
      local_128 = std::
                  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(pbStack_28,0);
      pbVar5 = std::
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_128);
      std::
      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(pbVar5,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      stringpiece_internal::StringPiece::StringPiece(&local_138,(char *)result_local);
      end_index = stringpiece_internal::StringPiece::find_first_not_of
                            ((StringPiece *)&delim_local,local_138,local_98);
    }
  }
  else {
    p._7_1_ = *(char *)&result_local->container;
    pcVar2 = stringpiece_internal::StringPiece::data((StringPiece *)&delim_local);
    end = pcVar2;
    sVar3 = stringpiece_internal::StringPiece::size((StringPiece *)&delim_local);
    start = pcVar2 + sVar3;
    while (pcVar1 = end, end != start) {
      if (*end == p._7_1_) {
        end = end + 1;
      }
      else {
        local_48 = end;
        do {
          end = end + 1;
          bVar6 = false;
          if (end != start) {
            bVar6 = *end != p._7_1_;
          }
        } while (bVar6);
        uVar4 = (long)end - (long)pcVar1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_68,pcVar1,uVar4,&local_69);
        begin_index = (size_type)
                      std::
                      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(pbStack_28,0);
        pbVar5 = std::
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&begin_index);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(pbVar5,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
      }
    }
  }
  return;
}

Assistant:

static inline void SplitStringToIteratorUsing(StringPiece full,
                                              const char *delim, ITR &result) {
  // Optimize the common case where delim is a single character.
  if (delim[0] != '\0' && delim[1] == '\0') {
    char c = delim[0];
    const char* p = full.data();
    const char* end = p + full.size();
    while (p != end) {
      if (*p == c) {
        ++p;
      } else {
        const char* start = p;
        while (++p != end && *p != c);
        *result++ = std::string(start, p - start);
      }
    }
    return;
  }

  std::string::size_type begin_index, end_index;
  begin_index = full.find_first_not_of(delim);
  while (begin_index != std::string::npos) {
    end_index = full.find_first_of(delim, begin_index);
    if (end_index == std::string::npos) {
      *result++ = std::string(full.substr(begin_index));
      return;
    }
    *result++ =
        std::string(full.substr(begin_index, (end_index - begin_index)));
    begin_index = full.find_first_not_of(delim, end_index);
  }
}